

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcode.cpp
# Opt level: O1

int jh_lex(void)

{
  size_t sVar1;
  char *pcVar2;
  int iVar3;
  char *b;
  int type;
  int local_24;
  
  local_24 = -1;
  sVar1 = fread(jh_buffer,1,0x1001,(FILE *)jh_in);
  if (sVar1 == 0) {
    iVar3 = -1;
  }
  else {
    iVar3 = 0;
    if (jh_buffer[0] != '\0') {
      b = jh_buffer;
      do {
        pcVar2 = jh_get_lexeme(b,&local_24);
        if (pcVar2 == b) {
          return -2;
        }
        jh_tackle(b,(int)pcVar2 - (int)b,local_24);
        b = pcVar2;
        iVar3 = 0;
      } while (*pcVar2 != '\0');
    }
  }
  return iVar3;
}

Assistant:

int jh_lex() {
    int type = -1;
    if (!fread(jh_buffer, 1, jh_buffer_sz, jh_in))
        return -1;
    char *lexemeBegin = jh_buffer;
    char *forward;

    while (*lexemeBegin != '\0') {
        forward = jh_get_lexeme(lexemeBegin, &type);
        if (forward == lexemeBegin) return -2;
        jh_tackle(lexemeBegin, (int)(forward - lexemeBegin), type);
        lexemeBegin = forward;
    }
    return 0;
}